

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O2

const_iterator __thiscall
r_code::list<r_exec::MDLController::REntry>::erase
          (list<r_exec::MDLController::REntry> *this,const_iterator *i)

{
  const_iterator cVar1;
  
  cVar1.super__iterator._cell = _erase(this,(i->super__iterator)._cell);
  cVar1._list = this;
  return cVar1;
}

Assistant:

const_iterator erase(const_iterator &i)
    {
        return const_iterator(this, _erase(i._cell)); // no check for i._cell==null.
    }